

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::interpolate_at_sample
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  ContextType ctxType;
  char *__s;
  NotSupportedError *this;
  long lVar2;
  string *shaderSource_00;
  DataType in_stack_fffffffffffffe48;
  allocator<char> local_1b1;
  string shaderSource;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"GL_OES_shader_multisample_interpolation",
               (allocator<char> *)&shaderSource);
    bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    if (!bVar1) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"This test requires a context version 3.2 or higher.",
                 "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_OES_shader_multisample_interpolation\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
                 ,0x1021);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"interpolateAtSample",(allocator<char> *)&local_170);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    shaderType = *(ShaderType *)((long)&(anonymous_namespace)::s_shaders + lVar2);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,__s,&local_1b1);
      std::operator+(&shaderSource,"Verify shader: ",&local_170);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_170);
      if (lVar2 == 4) {
        (anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x19,SHADER_FUNCTION_LAST,TYPE_INT,
                   in_stack_fffffffffffffe48);
        std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x19,SHADER_FUNCTION_BIT_COUNT,
                   TYPE_FLOAT,in_stack_fffffffffffffe48);
        std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x19,SHADER_FUNCTION_FIND_MSB,TYPE_FLOAT
                   ,in_stack_fffffffffffffe48);
        std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x19,SHADER_FUNCTION_FIND_LSB,TYPE_FLOAT
                   ,in_stack_fffffffffffffe48);
        std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x19,SHADER_FUNCTION_UADD_CARRY,
                   TYPE_FLOAT,in_stack_fffffffffffffe48);
        shaderSource_00 = &local_d0;
        std::__cxx11::string::string((string *)shaderSource_00,(string *)&shaderSource);
        verifyShader(ctx,shaderType,shaderSource_00);
      }
      else {
        (anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x19,SHADER_FUNCTION_BIT_COUNT,TYPE_INT,
                   in_stack_fffffffffffffe48);
        std::__cxx11::string::string((string *)&local_f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x19,SHADER_FUNCTION_FIND_MSB,TYPE_INT,
                   in_stack_fffffffffffffe48);
        std::__cxx11::string::string((string *)&local_110,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x19,SHADER_FUNCTION_FIND_LSB,TYPE_INT,
                   in_stack_fffffffffffffe48);
        std::__cxx11::string::string((string *)&local_130,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x19,SHADER_FUNCTION_UADD_CARRY,TYPE_INT
                   ,in_stack_fffffffffffffe48);
        shaderSource_00 = &local_150;
        std::__cxx11::string::string((string *)shaderSource_00,(string *)&shaderSource);
        verifyShader(ctx,shaderType,shaderSource_00);
      }
      std::__cxx11::string::~string((string *)shaderSource_00);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestContext::endSection(ctx);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void interpolate_at_sample (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_OES_shader_multisample_interpolation"),
		"This test requires a context version 3.2 or higher.");

	ctx.beginSection("interpolateAtSample");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			if (s_shaders[shaderNdx] == glu::SHADERTYPE_FRAGMENT)
			{
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_INT, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC2, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			else
			{
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC2, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE, glu::TYPE_FLOAT_VEC4, glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}